

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * testing::internal::OutputFlagAlsoCheckEnvVar_abi_cxx11_(void)

{
  char *pcVar1;
  long *plVar2;
  long *plVar3;
  string *in_RDI;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"");
  pcVar1 = getenv("XML_OUTPUT_FILE");
  if (pcVar1 != (char *)0x0) {
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"xml:","");
    plVar2 = (long *)std::__cxx11::string::append((char *)local_60);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_30 = *plVar3;
      lStack_28 = plVar2[3];
      local_40 = &local_30;
    }
    else {
      local_30 = *plVar3;
      local_40 = (long *)*plVar2;
    }
    local_38 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_40);
    if (local_40 != &local_30) {
      operator_delete(local_40);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
  }
  return in_RDI;
}

Assistant:

std::string OutputFlagAlsoCheckEnvVar() {
  std::string default_value_for_output_flag = "";
  const char* xml_output_file_env = posix::GetEnv("XML_OUTPUT_FILE");
  if (nullptr != xml_output_file_env) {
    default_value_for_output_flag = std::string("xml:") + xml_output_file_env;
  }
  return default_value_for_output_flag;
}